

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,Descriptor *value_descriptor,string *serialized_value)

{
  bool bVar1;
  Message *pMVar2;
  pointer message;
  MessageLite *pMVar3;
  DescriptorStringView str;
  AlphaNum local_188;
  AlphaNum local_158;
  AlphaNum local_128;
  undefined1 local_f8 [40];
  char *local_d0;
  string local_c8;
  undefined1 local_a8 [8];
  string sub_delimiter;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> value;
  Message *value_prototype;
  DynamicMessageFactory factory;
  string *serialized_value_local;
  Descriptor *value_descriptor_local;
  ParserImpl *this_local;
  
  factory.prototypes_mutex_.mu_.super___atomic_base<long>._M_i =
       (atomic<long>)(atomic<long>)serialized_value;
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&value_prototype);
  pMVar2 = DynamicMessageFactory::GetPrototype
                     ((DynamicMessageFactory *)&value_prototype,value_descriptor);
  if (pMVar2 == (Message *)0x0) {
    this_local._7_1_ = false;
    goto LAB_0056bbef;
  }
  pMVar2 = Message::New(pMVar2);
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )(sub_delimiter.field_2._M_local_buf + 8),pMVar2);
  std::__cxx11::string::string((string *)local_a8);
  bVar1 = ConsumeMessageDelimiter(this,(string *)local_a8);
  if (bVar1) {
    message = std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::get((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                     *)((long)&sub_delimiter.field_2 + 8));
    std::__cxx11::string::string((string *)&local_c8,(string *)local_a8);
    bVar1 = ConsumeMessage(this,message,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    if (bVar1) {
      if ((this->allow_partial_ & 1U) == 0) {
        pMVar3 = &std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                *)((long)&sub_delimiter.field_2 + 8))->super_MessageLite;
        bVar1 = MessageLite::IsInitialized(pMVar3);
        if (!bVar1) {
          absl::lts_20240722::AlphaNum::AlphaNum(&local_128,"Value of type \"");
          str = Descriptor::full_name_abi_cxx11_(value_descriptor);
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_158,str);
          absl::lts_20240722::AlphaNum::AlphaNum
                    (&local_188,"\" stored in google.protobuf.Any has missing required fields");
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_f8,&local_128,&local_158);
          join_0x00000010_0x00000000_ =
               (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f8);
          ReportError(this,join_0x00000010_0x00000000_);
          std::__cxx11::string::~string((string *)local_f8);
          this_local._7_1_ = false;
          goto LAB_0056bbc1;
        }
        pMVar3 = &std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                *)((long)&sub_delimiter.field_2 + 8))->super_MessageLite;
        MessageLite::AppendToString
                  (pMVar3,(string *)factory.prototypes_mutex_.mu_.super___atomic_base<long>._M_i);
      }
      else {
        pMVar3 = &std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                *)((long)&sub_delimiter.field_2 + 8))->super_MessageLite;
        MessageLite::AppendPartialToString
                  (pMVar3,(string *)factory.prototypes_mutex_.mu_.super___atomic_base<long>._M_i);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0056bbc1:
  std::__cxx11::string::~string((string *)local_a8);
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               *)((long)&sub_delimiter.field_2 + 8));
LAB_0056bbef:
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&value_prototype);
  return this_local._7_1_;
}

Assistant:

bool ConsumeAnyValue(const Descriptor* value_descriptor,
                       std::string* serialized_value) {
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == nullptr) {
      return false;
    }
    std::unique_ptr<Message> value(value_prototype->New());
    std::string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(absl::StrCat(
            "Value of type \"", value_descriptor->full_name(),
            "\" stored in google.protobuf.Any has missing required fields"));
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }